

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::TimingControlStatementSyntax_const&>
          (BumpAllocator *this,TimingControlStatementSyntax *args)

{
  TimingControlStatementSyntax *pTVar1;
  TimingControlStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pTVar1 = (TimingControlStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::TimingControlStatementSyntax::TimingControlStatementSyntax(in_RSI,pTVar1);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }